

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferVkImpl::BufferVkImpl
          (BufferVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceVkImpl *pRenderDeviceVk,
          BufferDesc *BuffDesc,RESOURCE_STATE InitialState,VkBuffer vkBuffer)

{
  RESOURCE_STATE InitialState_local;
  BufferDesc *BuffDesc_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  FixedBlockMemoryAllocator *BuffViewObjMemAllocator_local;
  IReferenceCounters *pRefCounters_local;
  BufferVkImpl *this_local;
  
  BufferBase<Diligent::EngineVkImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pRenderDeviceVk,BuffDesc,false);
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_010cd1a0;
  this->m_DynamicOffsetAlignment = 0;
  this->m_BufferMemoryAlignedOffset = 0;
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_VulkanBuffer,vkBuffer);
  VulkanUtilities::VulkanMemoryAllocation::VulkanMemoryAllocation(&this->m_MemoryAllocation);
  BufferBase<Diligent::EngineVkImplTraits>::SetState
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,InitialState);
  return;
}

Assistant:

BufferVkImpl::BufferVkImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceVkImpl*        pRenderDeviceVk,
                           const BufferDesc&          BuffDesc,
                           RESOURCE_STATE             InitialState,
                           VkBuffer                   vkBuffer) :
    TBufferBase{
        pRefCounters,
        BuffViewObjMemAllocator,
        pRenderDeviceVk,
        BuffDesc,
        false,
    },
    m_VulkanBuffer{vkBuffer}
{
    SetState(InitialState);
}